

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::Tokenizer(Tokenizer *this)

{
  allocator<char> local_41;
  string local_40 [40];
  _List_node_base *local_18;
  Tokenizer *local_10;
  Tokenizer *this_local;
  
  local_10 = this;
  std::__cxx11::list<Token,_std::allocator<Token>_>::list(&this->tokens);
  TokenizerPosition::TokenizerPosition(&this->position);
  Token::Token(&this->invalidToken);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::vector
            (&this->replacements);
  local_18 = (_List_node_base *)
             std::__cxx11::list<Token,_std::allocator<Token>_>::begin(&this->tokens);
  (this->position).it._M_node = local_18;
  (this->invalidToken).type = Invalid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Unexpected end of token stream",&local_41);
  Token::setValue<std::monostate>(&this->invalidToken,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

Tokenizer::Tokenizer()
{
	position.it = tokens.begin();
	invalidToken.type = TokenType::Invalid;
	invalidToken.setValue(std::monostate{}, "Unexpected end of token stream");
}